

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::internal::
parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
          *handler)

{
  internal *__last;
  internal *__last_00;
  int iVar1;
  wchar_t wVar2;
  internal *piVar3;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar4;
  internal *piVar5;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *this_00;
  char *message;
  internal *piVar6;
  bool bVar7;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             *)format_str.size_;
  __last_00 = this + (long)format_str.data_ * 4;
  do {
    if (this == __last_00) {
      return;
    }
    piVar5 = this;
    if (*(wchar_t *)this == L'{') {
LAB_00185e36:
      piVar6 = this;
      if (this != piVar5) {
        do {
          bVar7 = piVar6 != piVar5;
          piVar3 = piVar6;
          if (bVar7) {
            iVar1 = *(int *)piVar6;
            while (iVar1 != 0x7d) {
              piVar3 = piVar3 + 4;
              bVar7 = piVar3 != piVar5;
              if (piVar3 == piVar5) goto LAB_00185e74;
              iVar1 = *(int *)piVar3;
            }
            bVar7 = true;
          }
LAB_00185e74:
          if (bVar7) {
            __last = piVar3 + 4;
            if ((__last == piVar5) || (*(wchar_t *)__last != L'}')) {
              error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
              goto LAB_00185ed5;
            }
            bVar4.container =
                 (this_00->context).
                 super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
                 .out_.container;
            if (__last != piVar6) {
              bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                      __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                                ((wchar_t *)piVar6,(wchar_t *)__last,bVar4);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
            .out_.container = bVar4.container;
            piVar6 = piVar3 + 8;
            bVar7 = true;
          }
          else {
            bVar4.container =
                 (this_00->context).
                 super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
                 .out_.container;
            if (piVar6 != piVar5) {
              bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                      __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                                ((wchar_t *)piVar6,(wchar_t *)piVar5,bVar4);
            }
            (this_00->context).
            super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
            .out_.container = bVar4.container;
LAB_00185ed5:
            bVar7 = false;
          }
        } while (bVar7);
      }
      piVar6 = piVar5 + 4;
      if (piVar6 == __last_00) {
        message = "invalid format string";
        goto LAB_00185f31;
      }
      if ((char)*(wchar_t *)piVar6 == '}') {
        basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
        ::next_arg((format_arg *)&local_58.string,&this_00->context);
        (this_00->arg).type_ = local_48;
        (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
        (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_00185f17:
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ::on_replacement_field(this_00,(wchar_t *)piVar6);
      }
      else {
        if (*(wchar_t *)piVar6 != L'{') {
          local_58._0_8_ = this_00;
          piVar6 = (internal *)
                   parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>&,wchar_t>>
                             ((wchar_t *)piVar6,(wchar_t *)__last_00,
                              (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_&,_wchar_t>
                               *)&local_58.string);
          if (piVar6 == __last_00) {
            wVar2 = L'\0';
          }
          else {
            wVar2 = *(wchar_t *)piVar6;
          }
          if (wVar2 == L':') {
            piVar6 = (internal *)
                     format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                     ::on_format_specs(this_00,(wchar_t *)(piVar6 + 4),(wchar_t *)__last_00);
            if ((piVar6 != __last_00) && (*(wchar_t *)piVar6 == L'}')) goto LAB_00185ffd;
            message = "unknown format specifier";
          }
          else {
            if (wVar2 == L'}') goto LAB_00185f17;
            message = "missing \'}\' in format string";
          }
LAB_00185f31:
          error_handler::on_error((error_handler *)this_00,message);
          goto LAB_00185fdd;
        }
        bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                          ((wchar_t *)piVar6,(wchar_t *)(piVar5 + 8),
                           (this_00->context).
                           super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
                           .out_.container);
        (this_00->context).
        super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
        .out_.container = bVar4.container;
      }
LAB_00185ffd:
      this = piVar6 + 4;
      bVar7 = true;
    }
    else {
      bVar7 = true;
      wVar2 = *(wchar_t *)this;
      while (wVar2 != L'{') {
        piVar5 = piVar5 + 4;
        bVar7 = piVar5 != __last_00;
        if (piVar5 == __last_00) break;
        wVar2 = *(wchar_t *)piVar5;
      }
      piVar6 = this;
      if (bVar7) goto LAB_00185e36;
      do {
        bVar7 = piVar6 != __last_00;
        piVar5 = piVar6;
        if (bVar7) {
          wVar2 = *(wchar_t *)piVar6;
          while (wVar2 != L'}') {
            piVar5 = piVar5 + 4;
            bVar7 = piVar5 != __last_00;
            if (piVar5 == __last_00) goto LAB_00185f72;
            wVar2 = *(wchar_t *)piVar5;
          }
          bVar7 = true;
        }
LAB_00185f72:
        if (bVar7) {
          piVar3 = piVar5 + 4;
          if ((piVar3 == __last_00) || (*(wchar_t *)piVar3 != L'}')) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_00185fd3;
          }
          bVar4.container =
               (this_00->context).
               super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
               .out_.container;
          if (piVar3 != piVar6) {
            bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                    __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                              ((wchar_t *)piVar6,(wchar_t *)piVar3,bVar4);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
          .out_.container = bVar4.container;
          piVar6 = piVar5 + 8;
          bVar7 = true;
        }
        else {
          bVar4.container =
               (this_00->context).
               super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
               .out_.container;
          if (piVar6 != __last_00) {
            bVar4 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                    __copy_m<wchar_t_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                              ((wchar_t *)piVar6,(wchar_t *)__last_00,bVar4);
          }
          (this_00->context).
          super_context_base<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>,_wchar_t>
          .out_.container = bVar4.container;
LAB_00185fd3:
          bVar7 = false;
        }
      } while (bVar7);
LAB_00185fdd:
      bVar7 = false;
    }
    if (!bVar7) {
      return;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}